

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::PropertyReferenceWalk_Impl<false>
               (Var instance,RecyclableObject **propertyObject,PropertyId propertyId,Var *value,
               PropertyValueInfo *info,ScriptContext *requestContext)

{
  int iVar1;
  BOOL BVar2;
  RecyclableObject *this;
  uint uVar3;
  
  this = *propertyObject;
  uVar3 = 0;
  do {
    if (((this->type).ptr)->typeId == TypeIds_Null) {
LAB_009acfc1:
      *propertyObject = this;
      return uVar3;
    }
    iVar1 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x16])
                      (this,instance,(ulong)(uint)propertyId,value,info,requestContext);
    if (iVar1 != 0) {
      uVar3 = (uint)(iVar1 == 1);
      goto LAB_009acfc1;
    }
    BVar2 = RecyclableObject::SkipsPrototype(this);
    if (BVar2 != 0) goto LAB_009acfc1;
    this = GetPrototypeNoTrap(this);
  } while( true );
}

Assistant:

BOOL JavascriptOperators::PropertyReferenceWalk_Impl(Var instance, RecyclableObject** propertyObject, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        BOOL foundProperty = false;
        RecyclableObject* object = *propertyObject;
        while (!foundProperty && !JavascriptOperators::IsNull(object))
        {
            if (unscopables && JavascriptOperators::IsPropertyUnscopable(object, propertyId))
            {
                break;
            }
            else
            {
                PropertyQueryFlags result = object->GetPropertyReferenceQuery(instance, propertyId, value, info, requestContext);
                if (result != PropertyQueryFlags::Property_NotFound)
                {
                    foundProperty = JavascriptConversion::PropertyQueryFlagsToBoolean(result);
                    break;
                }
            }

            if (object->SkipsPrototype())
            {
                break; // will return false
            }

            object = JavascriptOperators::GetPrototypeNoTrap(object);

        }
        *propertyObject = object;
        return foundProperty;
    }